

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool libcellml::hasComponentImports(ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ComponentPtr childComponent;
  __shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  bVar2 = false;
  uVar4 = 0;
  while( true ) {
    sVar3 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    if ((bVar2 != false) || (sVar3 <= uVar4)) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_40,
               (size_t)(componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    bVar1 = ImportedEntity::isImport(&(local_40._M_ptr)->super_ImportedEntity);
    bVar2 = true;
    if (!bVar1) {
      std::__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Component,void>(local_50,&local_40);
      bVar2 = hasComponentImports((ComponentEntityConstPtr *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    uVar4 = uVar4 + 1;
  }
  return bVar2;
}

Assistant:

bool hasComponentImports(const ComponentEntityConstPtr &componentEntity)
{
    bool importsPresent = false;
    for (size_t index = 0; (index < componentEntity->componentCount()) && !importsPresent; ++index) {
        libcellml::ComponentPtr childComponent = componentEntity->component(index);
        importsPresent = childComponent->isImport();
        if (!importsPresent) {
            importsPresent = hasComponentImports(childComponent);
        }
    }
    return importsPresent;
}